

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O1

void __thiscall kiste::parse_context::update(parse_context *this,line_data_t *line_data)

{
  char cVar1;
  line_type lVar2;
  size_type sVar3;
  pointer psVar4;
  bool bVar5;
  parse_error *this_00;
  size_t sVar6;
  size_type sVar7;
  
  sVar6 = this->_curly_level;
  lVar2 = line_data->_type;
  if ((lVar2 == cpp) && (sVar3 = (this->_line)._M_string_length, sVar3 != 0)) {
    sVar7 = 0;
    do {
      cVar1 = (this->_line)._M_dataplus._M_p[sVar7];
      if (cVar1 == '}') {
        if (sVar6 == 0) {
          this_00 = (parse_error *)__cxa_allocate_exception(0x10);
          parse_error::parse_error(this_00,"Too many closing curly braces in C++");
          __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
        }
        sVar6 = sVar6 - 1;
      }
      else if (cVar1 == '{') {
        sVar6 = sVar6 + 1;
      }
      sVar7 = sVar7 + 1;
    } while (sVar3 != sVar7);
  }
  this->_curly_level = sVar6;
  if (lVar2 == class_end) {
    sVar6 = 0;
  }
  else if (lVar2 != class_begin) {
    sVar6 = this->_class_curly_level;
  }
  this->_class_curly_level = sVar6;
  if (((lVar2 == text) &&
      (psVar4 = (line_data->_segments).
                super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
                super__Vector_impl_data._M_finish,
      (line_data->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar4)) &&
     (psVar4[-1]._type == trim_trailing_return)) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
  }
  this->_has_trailing_return = bVar5;
  return;
}

Assistant:

auto determine_curly_level(const parse_context& ctx, const line_data_t& line_data)
        -> std::size_t
    {
      auto level = ctx._curly_level;
      if (line_data._type != line_type::cpp)
      {
        return level;
      }

      for (const auto& c : ctx._line)
      {
        switch (c)
        {
        case '{':
          ++level;
          break;
        case '}':
          if (level == 0)
            throw parse_error("Too many closing curly braces in C++");
          --level;
          break;
        default:
          break;
        }
      }
      return level;
    }